

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O0

sc_string_old * __thiscall sc_dt::sc_string_old::operator=(sc_string_old *this,char *s)

{
  sc_string_rep *this_00;
  sc_string_old *in_RDI;
  char *in_stack_ffffffffffffffc8;
  sc_string_rep *in_stack_ffffffffffffffe0;
  
  if (in_RDI->rep->ref_count < 2) {
    sc_string_rep::set_string(in_stack_ffffffffffffffe0,(char *)in_RDI);
  }
  else {
    in_RDI->rep->ref_count = in_RDI->rep->ref_count + -1;
    this_00 = (sc_string_rep *)operator_new(0x10);
    sc_string_rep::sc_string_rep(this_00,in_stack_ffffffffffffffc8);
    in_RDI->rep = this_00;
  }
  return in_RDI;
}

Assistant:

sc_string_old&
sc_string_old::operator=( const char* s )
{
    if (rep->ref_count > 1) {
        --rep->ref_count;
        rep = new sc_string_rep(s);
    }
    else {
        rep->set_string(s);
    }
    return *this;
}